

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O1

void __thiscall duckdb::StringAggBindData::~StringAggBindData(StringAggBindData *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__StringAggBindData_00897f50;
  pcVar1 = (this->sep)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sep).field_2) {
    operator_delete(pcVar1);
  }
  duckdb::FunctionData::~FunctionData(&this->super_FunctionData);
  operator_delete(this);
  return;
}

Assistant:

explicit StringAggBindData(string sep_p) : sep(std::move(sep_p)) {
	}